

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMultiLoad(Vdbe *p,int iDest,char *zTypes,...)

{
  char cVar1;
  int p2;
  char in_AL;
  undefined8 *puVar2;
  int *piVar3;
  uint uVar4;
  undefined8 in_RCX;
  ulong uVar5;
  int op;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  int local_e8 [6];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = &stack0x00000008;
  uVar4 = 0x18;
  lVar6 = 0;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    cVar1 = zTypes[lVar6];
    p2 = (int)lVar6;
    if (cVar1 == 'i') {
      uVar5 = (ulong)uVar4;
      if (uVar5 < 0x29) {
        uVar4 = uVar4 + 8;
        piVar3 = (int *)((long)local_e8 + uVar5);
      }
      else {
        piVar3 = (int *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      sqlite3VdbeAddOp2(p,0x46,*piVar3,iDest + p2);
    }
    else {
      if (cVar1 != 's') {
        if (cVar1 == '\0') {
          sqlite3VdbeAddOp2(p,0x51,iDest,p2);
        }
        return;
      }
      uVar5 = (ulong)uVar4;
      if (uVar5 < 0x29) {
        uVar4 = uVar4 + 8;
        puVar2 = (undefined8 *)((long)local_e8 + uVar5);
      }
      else {
        puVar2 = (undefined8 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      op = 0x6e;
      if ((char *)*puVar2 == (char *)0x0) {
        op = 0x49;
      }
      sqlite3VdbeAddOp4(p,op,0,iDest + p2,0,(char *)*puVar2,0);
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMultiLoad(Vdbe *p, int iDest, const char *zTypes, ...){
  va_list ap;
  int i;
  char c;
  va_start(ap, zTypes);
  for(i=0; (c = zTypes[i])!=0; i++){
    if( c=='s' ){
      const char *z = va_arg(ap, const char*);
      sqlite3VdbeAddOp4(p, z==0 ? OP_Null : OP_String8, 0, iDest+i, 0, z, 0);
    }else if( c=='i' ){
      sqlite3VdbeAddOp2(p, OP_Integer, va_arg(ap, int), iDest+i);
    }else{
      goto skip_op_resultrow;
    }
  }
  sqlite3VdbeAddOp2(p, OP_ResultRow, iDest, i);
skip_op_resultrow:
  va_end(ap);
}